

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthPrintProfile_int(uint *pTruth,int nVars)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *pBytesInit;
  uint *pOut_00;
  uint *pTruth0;
  uint *pTruth0_00;
  uint *pTruth1;
  uint uVar14;
  int iVar15;
  int Coz11;
  int Coz10;
  int Coz01;
  int Coz00;
  int Cof11;
  int Cof10;
  int Cof01;
  int Cof00;
  int nMints1;
  int iVar;
  int i;
  int u;
  int v;
  int nTotalMints1;
  int nTotalMints0;
  int nTotalMints;
  uint *pTemp;
  uint *pCof11;
  uint *pCof10;
  uint *pCof01;
  uint *pCof00;
  uint *pOut;
  uint *pIn;
  int *pBytes;
  uint local_1418;
  int nWords;
  int Common2 [20] [20];
  int Unique2 [20] [20];
  int Total2 [20] [20];
  int Unique1 [20];
  int Mints1 [20];
  int Mints0 [20];
  int Mints [20];
  int nVars_local;
  uint *pTruth_local;
  
  iVar2 = Kit_TruthWordNum(nVars);
  pBytesInit = (int *)malloc((long)(iVar2 << 2) << 2);
  pOut = (uint *)malloc((long)iVar2 << 2);
  pCof00 = (uint *)malloc((long)iVar2 << 2);
  pOut_00 = (uint *)malloc((long)iVar2 << 2);
  pTruth0 = (uint *)malloc((long)iVar2 << 2);
  pTruth0_00 = (uint *)malloc((long)iVar2 << 2);
  pTruth1 = (uint *)malloc((long)iVar2 << 2);
  if (0x14 < nVars) {
    __assert_fail("nVars <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x803,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x804,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  iVar3 = Kit_TruthCountMinterms(pTruth,nVars,Mints0 + 0x12,pBytesInit);
  for (i = 0; i < nVars; i = i + 1) {
    iVar4 = Kit_TruthBooleanDiffCount(pTruth,nVars,i);
    Unique1[(long)i + -2] = iVar4;
  }
  for (i = 0; i < nVars; i = i + 1) {
    for (iVar = 0; iVar < nVars; iVar = iVar + 1) {
      (&local_1418)[(long)i * 0x14 + (long)iVar] = 0xffffffff;
      Common2[(long)i + 0x13][(long)iVar + 0x12] = -1;
      Unique2[(long)i + 0x13][(long)iVar + 0x12] = -1;
    }
  }
  iVar4 = 1 << ((char)nVars - 2U & 0x1f);
  i = 0;
  do {
    if (nVars <= i) {
      printf("\n");
      printf(" V: ");
      for (i = 0; i < nVars; i = i + 1) {
        printf("%8c  ",(ulong)(i + 0x61));
      }
      printf("\n");
      printf(" M: ");
      for (i = 0; i < nVars; i = i + 1) {
        printf("%8d  ",(ulong)(uint)Mints0[(long)i + 0x12]);
      }
      printf("\n");
      printf(" U: ");
      for (i = 0; i < nVars; i = i + 1) {
        printf("%8d  ",(ulong)(uint)Unique1[(long)i + -2]);
      }
      printf("\n");
      printf("\n");
      printf("Unique:\n");
      for (nMints1 = 0; nMints1 < nVars; nMints1 = nMints1 + 1) {
        printf(" %2d ",(ulong)(uint)nMints1);
        for (i = 0; i < nVars; i = i + 1) {
          printf("%8d  ",(ulong)(uint)Common2[(long)nMints1 + 0x13][(long)i + 0x12]);
        }
        printf("\n");
      }
      printf("Common:\n");
      for (nMints1 = 0; nMints1 < nVars; nMints1 = nMints1 + 1) {
        printf(" %2d ",(ulong)(uint)nMints1);
        for (i = 0; i < nVars; i = i + 1) {
          printf("%8d  ",(ulong)(&local_1418)[(long)nMints1 * 0x14 + (long)i]);
        }
        printf("\n");
      }
      printf("Total:\n");
      for (nMints1 = 0; nMints1 < nVars; nMints1 = nMints1 + 1) {
        printf(" %2d ",(ulong)(uint)nMints1);
        for (i = 0; i < nVars; i = i + 1) {
          printf("%8d  ",(ulong)(uint)Unique2[(long)nMints1 + 0x13][(long)i + 0x12]);
        }
        printf("\n");
      }
      if (pOut != (uint *)0x0) {
        free(pOut);
      }
      if (pCof00 != (uint *)0x0) {
        free(pCof00);
      }
      if (pOut_00 != (uint *)0x0) {
        free(pOut_00);
      }
      if (pTruth0 != (uint *)0x0) {
        free(pTruth0);
      }
      if (pTruth0_00 != (uint *)0x0) {
        free(pTruth0_00);
      }
      if (pTruth1 != (uint *)0x0) {
        free(pTruth1);
      }
      if (pBytesInit != (int *)0x0) {
        free(pBytesInit);
      }
      return;
    }
    Kit_TruthCopy(pOut,pTruth,nVars);
    for (nMints1 = i; nMints1 < nVars + -1; nMints1 = nMints1 + 1) {
      Kit_TruthSwapAdjacentVars(pCof00,pOut,nVars,nMints1);
      puVar1 = pCof00;
      pCof00 = pOut;
      pOut = puVar1;
    }
    iVar5 = Kit_TruthCountMinterms(pOut,nVars + -1,Mints1 + 0x12,pBytesInit);
    iVar6 = Kit_TruthCountMinterms(pOut + iVar2 / 2,nVars + -1,Unique1 + 0x12,pBytesInit);
    if (iVar3 != iVar5 + iVar6) {
      __assert_fail("nTotalMints == nTotalMints0 + nTotalMints1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                    ,0x820,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
    }
    for (iVar = 0; iVar < nVars + -1; iVar = iVar + 1) {
      if (iVar < i) {
        Cof00 = iVar;
      }
      else {
        Cof00 = iVar + 1;
      }
      if (i == Cof00) {
        __assert_fail("v != iVar",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x830,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar15 = Mints1[(long)iVar + 0x12];
      iVar7 = iVar4 - iVar15;
      iVar8 = iVar5 - Mints1[(long)iVar + 0x12];
      iVar9 = iVar4 - iVar8;
      iVar13 = Unique1[(long)iVar + 0x12];
      iVar10 = iVar4 - iVar13;
      iVar11 = iVar6 - Unique1[(long)iVar + 0x12];
      iVar12 = iVar4 - iVar11;
      if ((iVar15 < 0) || (iVar4 < iVar15)) {
        __assert_fail("Cof00 >= 0 && Cof00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x837,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar8 < 0) || (iVar4 < iVar8)) {
        __assert_fail("Cof01 >= 0 && Cof01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x838,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar13 < 0) || (iVar4 < iVar13)) {
        __assert_fail("Cof10 >= 0 && Cof10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x839,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar11 < 0) || (iVar4 < iVar11)) {
        __assert_fail("Cof11 >= 0 && Cof11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83a,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar7 < 0) || (iVar4 < iVar7)) {
        __assert_fail("Coz00 >= 0 && Coz00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83c,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar9 < 0) || (iVar4 < iVar9)) {
        __assert_fail("Coz01 >= 0 && Coz01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83d,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar10 < 0) || (iVar4 < iVar10)) {
        __assert_fail("Coz10 >= 0 && Coz10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83e,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      if ((iVar12 < 0) || (iVar4 < iVar12)) {
        __assert_fail("Coz11 >= 0 && Coz11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83f,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      uVar14 = iVar15 * iVar12 + iVar7 * iVar11 + iVar8 * iVar10 + iVar9 * iVar13;
      (&local_1418)[(long)Cof00 * 0x14 + (long)i] = uVar14;
      (&local_1418)[(long)i * 0x14 + (long)Cof00] = uVar14;
      iVar15 = iVar15 * iVar9 + iVar7 * iVar8 + iVar15 * iVar10 + iVar7 * iVar13 + iVar15 * iVar12 +
               iVar7 * iVar11 + iVar8 * iVar10 + iVar9 * iVar13 + iVar8 * iVar12 + iVar9 * iVar11 +
               iVar13 * iVar12 + iVar10 * iVar11;
      Unique2[(long)Cof00 + 0x13][(long)i + 0x12] = iVar15;
      Unique2[(long)i + 0x13][(long)Cof00 + 0x12] = iVar15;
      Kit_TruthCofactor0New(pOut_00,pOut,nVars + -1,iVar);
      Kit_TruthCofactor1New(pTruth0,pOut,nVars + -1,iVar);
      Kit_TruthCofactor0New(pTruth0_00,pOut + iVar2 / 2,nVars + -1,iVar);
      Kit_TruthCofactor1New(pTruth1,pOut + iVar2 / 2,nVars + -1,iVar);
      iVar15 = Kit_TruthXorCount(pOut_00,pTruth0,nVars + -1);
      iVar13 = Kit_TruthXorCount(pOut_00,pTruth0_00,nVars + -1);
      iVar7 = Kit_TruthXorCount(pOut_00,pTruth1,nVars + -1);
      iVar8 = Kit_TruthXorCount(pTruth0,pTruth0_00,nVars + -1);
      iVar9 = Kit_TruthXorCount(pTruth0,pTruth1,nVars + -1);
      iVar10 = Kit_TruthXorCount(pTruth0_00,pTruth1,nVars + -1);
      iVar10 = iVar15 + iVar13 + iVar7 + iVar8 + iVar9 + iVar10;
      Common2[(long)Cof00 + 0x13][(long)i + 0x12] = iVar10;
      Common2[(long)i + 0x13][(long)Cof00 + 0x12] = iVar10;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Kit_TruthPrintProfile_int( unsigned * pTruth, int nVars )
{
    int Mints[20];
    int Mints0[20];
    int Mints1[20];
    int Unique1[20];
    int Total2[20][20];
    int Unique2[20][20];
    int Common2[20][20];
    int nWords = Kit_TruthWordNum( nVars );
    int * pBytes    = ABC_ALLOC( int, nWords * 4 );
    unsigned * pIn  = ABC_ALLOC( unsigned, nWords );
    unsigned * pOut = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof00 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof01 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof10 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof11 = ABC_ALLOC( unsigned, nWords );
    unsigned * pTemp;
    int nTotalMints, nTotalMints0, nTotalMints1;
    int v, u, i, iVar, nMints1;
    int Cof00, Cof01, Cof10, Cof11;
    int Coz00, Coz01, Coz10, Coz11;
    assert( nVars <= 20 );
    assert( nVars >=  6 );

    nTotalMints = Kit_TruthCountMinterms( pTruth, nVars, Mints, pBytes );
    for ( v = 0; v < nVars; v++ )
        Unique1[v] = Kit_TruthBooleanDiffCount( pTruth, nVars, v );

    for ( v = 0; v < nVars; v++ )
    for ( u = 0; u < nVars; u++ )
        Total2[v][u] = Unique2[v][u] = Common2[v][u] = -1;

    nMints1 = (1<<(nVars-2));
    for ( v = 0; v < nVars; v++ )
    {
        // move this var to be the first
        Kit_TruthCopy( pIn, pTruth, nVars );
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
        for ( i = v; i < nVars - 1; i++ )
        {
            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
//        printf( "\n" );


        // count minterms in both cofactor
        nTotalMints0 = Kit_TruthCountMinterms( pIn,          nVars-1, Mints0, pBytes );
        nTotalMints1 = Kit_TruthCountMinterms( pIn+nWords/2, nVars-1, Mints1, pBytes );
        assert( nTotalMints == nTotalMints0 + nTotalMints1 );
/*
        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints0[u] );
        printf( "\n" );

        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints1[u] );
        printf( "\n" );
*/
        for ( u = 0; u < nVars-1; u++ )
        {
            if ( u < v )
                iVar = u;
            else 
                iVar = u + 1;
            assert( v != iVar );
            // get minter counts in the cofactors
            Cof00 =              Mints0[u]; Coz00 = nMints1 - Cof00;              
            Cof01 = nTotalMints0-Mints0[u]; Coz01 = nMints1 - Cof01;
            Cof10 =              Mints1[u]; Coz10 = nMints1 - Cof10;
            Cof11 = nTotalMints1-Mints1[u]; Coz11 = nMints1 - Cof11;

            assert( Cof00 >= 0 && Cof00 <= nMints1 );
            assert( Cof01 >= 0 && Cof01 <= nMints1 );
            assert( Cof10 >= 0 && Cof10 <= nMints1 );
            assert( Cof11 >= 0 && Cof11 <= nMints1 );

            assert( Coz00 >= 0 && Coz00 <= nMints1 );
            assert( Coz01 >= 0 && Coz01 <= nMints1 );
            assert( Coz10 >= 0 && Coz10 <= nMints1 );
            assert( Coz11 >= 0 && Coz11 <= nMints1 );

            Common2[v][iVar] = Common2[iVar][v] = Cof00 * Coz11 + Coz00 * Cof11 + Cof01 * Coz10 + Coz01 * Cof10;

            Total2[v][iVar] = Total2[iVar][v] = 
                Cof00 * Coz01 + Coz00 * Cof01 + 
                Cof00 * Coz10 + Coz00 * Cof10 + 
                Cof00 * Coz11 + Coz00 * Cof11 + 
                Cof01 * Coz10 + Coz01 * Cof10 + 
                Cof01 * Coz11 + Coz01 * Cof11 + 
                Cof10 * Coz11 + Coz10 * Cof11 ;

            
            Kit_TruthCofactor0New( pCof00, pIn,          nVars-1, u );
            Kit_TruthCofactor1New( pCof01, pIn,          nVars-1, u );
            Kit_TruthCofactor0New( pCof10, pIn+nWords/2, nVars-1, u );
            Kit_TruthCofactor1New( pCof11, pIn+nWords/2, nVars-1, u );

            Unique2[v][iVar] = Unique2[iVar][v] = 
                Kit_TruthXorCount( pCof00, pCof01, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof10, pCof11, nVars-1 );
        }
    }

    printf( "\n" );
    printf( " V: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8c  ", v+'a' );
    printf( "\n" );

    printf( " M: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Mints[v] );
    printf( "\n" );

    printf( " U: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique1[v] );
    printf( "\n" );
    printf( "\n" );

    printf( "Unique:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique2[i][v] );
    printf( "\n" );
    }

    printf( "Common:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Common2[i][v] );
    printf( "\n" );
    }

    printf( "Total:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Total2[i][v] );
    printf( "\n" );
    }

    ABC_FREE( pIn );
    ABC_FREE( pOut );
    ABC_FREE( pCof00 );
    ABC_FREE( pCof01 );
    ABC_FREE( pCof10 );
    ABC_FREE( pCof11 );
    ABC_FREE( pBytes );
}